

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int saveCursorPosition(BtCursor *pCur)

{
  int iVar1;
  void *pvVar2;
  long in_RDI;
  void *pKey;
  int rc;
  i64 *in_stack_ffffffffffffffe8;
  uint in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  
  if (*(char *)(in_RDI + 0x6d) == '\x02') {
    *(undefined1 *)(in_RDI + 0x6d) = 1;
  }
  else {
    *(undefined4 *)(in_RDI + 0x68) = 0;
  }
  iVar1 = sqlite3BtreeKeySize((BtCursor *)
                              CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
                              in_stack_ffffffffffffffe8);
  if (*(char *)(*(long *)(in_RDI + 0xa0) + 2) == '\0') {
    pvVar2 = sqlite3Malloc(CONCAT44(iVar1,in_stack_fffffffffffffff0));
    if (pvVar2 == (void *)0x0) {
      iVar1 = 7;
    }
    else {
      iVar1 = sqlite3BtreeKey((BtCursor *)CONCAT44(iVar1,in_stack_fffffffffffffff0),
                              (u32)((ulong)pvVar2 >> 0x20),(u32)pvVar2,(void *)0x135e3f);
      if (iVar1 == 0) {
        *(void **)(in_RDI + 0x58) = pvVar2;
      }
      else {
        sqlite3_free((void *)0x135e62);
      }
    }
  }
  if (iVar1 == 0) {
    btreeReleaseAllCursorPages((BtCursor *)(ulong)in_stack_fffffffffffffff0);
    *(undefined1 *)(in_RDI + 0x6d) = 3;
  }
  *(byte *)(in_RDI + 0x6c) = *(byte *)(in_RDI + 0x6c) & 0xfb;
  return iVar1;
}

Assistant:

static int saveCursorPosition(BtCursor *pCur){
  int rc;

  assert( CURSOR_VALID==pCur->eState || CURSOR_SKIPNEXT==pCur->eState );
  assert( 0==pCur->pKey );
  assert( cursorHoldsMutex(pCur) );

  if( pCur->eState==CURSOR_SKIPNEXT ){
    pCur->eState = CURSOR_VALID;
  }else{
    pCur->skipNext = 0;
  }
  rc = sqlite3BtreeKeySize(pCur, &pCur->nKey);
  assert( rc==SQLITE_OK );  /* KeySize() cannot fail */

  /* If this is an intKey table, then the above call to BtreeKeySize()
  ** stores the integer key in pCur->nKey. In this case this value is
  ** all that is required. Otherwise, if pCur is not open on an intKey
  ** table, then malloc space for and store the pCur->nKey bytes of key 
  ** data.
  */
  if( 0==pCur->apPage[0]->intKey ){
    void *pKey = sqlite3Malloc( pCur->nKey );
    if( pKey ){
      rc = sqlite3BtreeKey(pCur, 0, (int)pCur->nKey, pKey);
      if( rc==SQLITE_OK ){
        pCur->pKey = pKey;
      }else{
        sqlite3_free(pKey);
      }
    }else{
      rc = SQLITE_NOMEM;
    }
  }
  assert( !pCur->apPage[0]->intKey || !pCur->pKey );

  if( rc==SQLITE_OK ){
    btreeReleaseAllCursorPages(pCur);
    pCur->eState = CURSOR_REQUIRESEEK;
  }

  invalidateOverflowCache(pCur);
  return rc;
}